

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmUseMangledMesaCommand.cxx
# Opt level: O2

void __thiscall
cmUseMangledMesaCommand::CopyAndFullPathMesaHeader
          (cmUseMangledMesaCommand *this,char *source,char *outdir)

{
  bool bVar1;
  ostream *poVar2;
  string tempOutputFile;
  string outFile;
  string includeFile;
  string inLine;
  string file;
  string dir;
  string gfile;
  RegularExpression glDirLine;
  ifstream fin;
  byte abStack_5b8 [488];
  ofstream fout;
  RegularExpression glLine;
  RegularExpression includeLine;
  
  dir._M_dataplus._M_p = (pointer)&dir.field_2;
  dir._M_string_length = 0;
  dir.field_2._M_local_buf[0] = '\0';
  file._M_dataplus._M_p = (pointer)&file.field_2;
  file._M_string_length = 0;
  file.field_2._M_local_buf[0] = '\0';
  std::__cxx11::string::string((string *)&fin,source,(allocator *)&fout);
  cmsys::SystemTools::SplitProgramPath((string *)&fin,&dir,&file,true);
  std::__cxx11::string::~string((string *)&fin);
  std::__cxx11::string::string((string *)&outFile,outdir,(allocator *)&fin);
  std::__cxx11::string::append((char *)&outFile);
  std::__cxx11::string::append((string *)&outFile);
  std::__cxx11::string::string((string *)&tempOutputFile,(string *)&outFile);
  std::__cxx11::string::append((char *)&tempOutputFile);
  std::ofstream::ofstream(&fout,tempOutputFile._M_dataplus._M_p,_S_out);
  if (((&fout.super_basic_ostream<char,_std::char_traits<char>_>.field_0x20)
       [(long)fout.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream[-3]] & 5)
      == 0) {
    std::ifstream::ifstream(&fin,source,_S_in);
    if ((abStack_5b8[*(long *)(_fin + -0x18)] & 5) == 0) {
      inLine._M_dataplus._M_p = (pointer)&inLine.field_2;
      inLine._M_string_length = 0;
      inLine.field_2._M_local_buf[0] = '\0';
      cmsys::RegularExpression::RegularExpression
                (&includeLine,"^[ \t]*#[ \t]*include[ \t]*[<\"]([^\">]+)[\">]");
      cmsys::RegularExpression::RegularExpression(&glDirLine,"(gl|GL)(/|\\\\)([^<\"]+)");
      cmsys::RegularExpression::RegularExpression(&glLine,"(gl|GL|xmesa)");
      while( true ) {
        bVar1 = cmsys::SystemTools::GetLineFromStream((istream *)&fin,&inLine,(bool *)0x0,-1);
        if (!bVar1) break;
        bVar1 = cmsys::RegularExpression::find(&includeLine,inLine._M_dataplus._M_p);
        if (bVar1) {
          cmsys::RegularExpression::match_abi_cxx11_(&includeFile,&includeLine,1);
          bVar1 = cmsys::RegularExpression::find(&glDirLine,includeFile._M_dataplus._M_p);
          if (bVar1) {
            cmsys::RegularExpression::match_abi_cxx11_(&gfile,&glDirLine,3);
            poVar2 = std::operator<<(&fout.super_basic_ostream<char,_std::char_traits<char>_>,
                                     "#include \"");
            poVar2 = std::operator<<(poVar2,outdir);
            poVar2 = std::operator<<(poVar2,"/");
            poVar2 = std::operator<<(poVar2,(string *)&gfile);
            std::operator<<(poVar2,"\"\n");
LAB_00379685:
            std::__cxx11::string::~string((string *)&gfile);
          }
          else {
            bVar1 = cmsys::RegularExpression::find(&glLine,includeFile._M_dataplus._M_p);
            if (bVar1) {
              poVar2 = std::operator<<(&fout.super_basic_ostream<char,_std::char_traits<char>_>,
                                       "#include \"");
              poVar2 = std::operator<<(poVar2,outdir);
              poVar2 = std::operator<<(poVar2,"/");
              cmsys::RegularExpression::match_abi_cxx11_(&gfile,&includeLine,1);
              poVar2 = std::operator<<(poVar2,(string *)&gfile);
              std::operator<<(poVar2,"\"\n");
              goto LAB_00379685;
            }
            poVar2 = std::operator<<(&fout.super_basic_ostream<char,_std::char_traits<char>_>,
                                     (string *)&inLine);
            std::operator<<(poVar2,"\n");
          }
          std::__cxx11::string::~string((string *)&includeFile);
        }
        else {
          poVar2 = std::operator<<(&fout.super_basic_ostream<char,_std::char_traits<char>_>,
                                   (string *)&inLine);
          std::operator<<(poVar2,"\n");
        }
      }
      std::ifstream::close();
      std::ofstream::close();
      cmSystemTools::CopyFileIfDifferent(tempOutputFile._M_dataplus._M_p,outFile._M_dataplus._M_p);
      cmsys::SystemTools::RemoveFile(&tempOutputFile);
      cmsys::RegularExpression::~RegularExpression(&glLine);
      cmsys::RegularExpression::~RegularExpression(&glDirLine);
      cmsys::RegularExpression::~RegularExpression(&includeLine);
      std::__cxx11::string::~string((string *)&inLine);
    }
    else {
      cmSystemTools::Error
                ("Could not open file for read in copy operation",source,(char *)0x0,(char *)0x0);
    }
    std::ifstream::~ifstream(&fin);
  }
  else {
    cmSystemTools::Error
              ("Could not open file for write in copy operation: ",tempOutputFile._M_dataplus._M_p,
               outdir,(char *)0x0);
    cmSystemTools::ReportLastSystemError("");
  }
  std::ofstream::~ofstream(&fout);
  std::__cxx11::string::~string((string *)&tempOutputFile);
  std::__cxx11::string::~string((string *)&outFile);
  std::__cxx11::string::~string((string *)&file);
  std::__cxx11::string::~string((string *)&dir);
  return;
}

Assistant:

void cmUseMangledMesaCommand::CopyAndFullPathMesaHeader(const char* source,
                                                        const char* outdir)
{
  std::string dir, file;
  cmSystemTools::SplitProgramPath(source, dir, file);
  std::string outFile = outdir;
  outFile += "/";
  outFile += file;
  std::string tempOutputFile = outFile;
  tempOutputFile += ".tmp";
  cmsys::ofstream fout(tempOutputFile.c_str());
  if (!fout) {
    cmSystemTools::Error("Could not open file for write in copy operation: ",
                         tempOutputFile.c_str(), outdir);
    cmSystemTools::ReportLastSystemError("");
    return;
  }
  cmsys::ifstream fin(source);
  if (!fin) {
    cmSystemTools::Error("Could not open file for read in copy operation",
                         source);
    return;
  }
  // now copy input to output and expand variables in the
  // input file at the same time
  std::string inLine;
  // regular expression for any #include line
  cmsys::RegularExpression includeLine(
    "^[ \t]*#[ \t]*include[ \t]*[<\"]([^\">]+)[\">]");
  // regular expression for gl/ or GL/ in a file (match(1) of above)
  cmsys::RegularExpression glDirLine("(gl|GL)(/|\\\\)([^<\"]+)");
  // regular expression for gl GL or xmesa in a file (match(1) of above)
  cmsys::RegularExpression glLine("(gl|GL|xmesa)");
  while (cmSystemTools::GetLineFromStream(fin, inLine)) {
    if (includeLine.find(inLine.c_str())) {
      std::string includeFile = includeLine.match(1);
      if (glDirLine.find(includeFile.c_str())) {
        std::string gfile = glDirLine.match(3);
        fout << "#include \"" << outdir << "/" << gfile << "\"\n";
      } else if (glLine.find(includeFile.c_str())) {
        fout << "#include \"" << outdir << "/" << includeLine.match(1)
             << "\"\n";
      } else {
        fout << inLine << "\n";
      }
    } else {
      fout << inLine << "\n";
    }
  }
  // close the files before attempting to copy
  fin.close();
  fout.close();
  cmSystemTools::CopyFileIfDifferent(tempOutputFile.c_str(), outFile.c_str());
  cmSystemTools::RemoveFile(tempOutputFile);
}